

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::LE_Fire_PDU::SetTargetEntityIDFlag(LE_Fire_PDU *this,KBOOL F)

{
  if ((KBOOL)((this->m_FireFlagUnion).m_ui8Flag & 1) != F) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xfe | F;
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 8 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 4;
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetTargetEntityIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8TargetId )return;

    m_FireFlagUnion.m_ui8TargetId = F;

    if( F )
    {
        m_ui16PDULength += LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
    else
    {
        m_ui16PDULength -= LE_EntityIdentifier::LE_ENTITY_IDENTIFER_SIZE;
    }
}